

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

int8_t __thiscall icu_63::UnicodeString::compare(UnicodeString *this,UnicodeString *text)

{
  int8_t iVar1;
  int32_t thisLength;
  int32_t srcLength;
  UnicodeString *text_local;
  UnicodeString *this_local;
  
  thisLength = length(this);
  srcLength = length(text);
  iVar1 = doCompare(this,0,thisLength,text,0,srcLength);
  return iVar1;
}

Assistant:

inline int8_t
UnicodeString::compare(const UnicodeString& text) const
{ return doCompare(0, length(), text, 0, text.length()); }